

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O2

LY_ERR lyd_new_path_(lyd_node *parent,ly_ctx *ctx,lysc_ext_instance *ext,char *path,void *value,
                    size_t value_len,LYD_ANYDATA_VALUETYPE value_type,uint32_t options,
                    lyd_node **new_parent,lyd_node **new_node)

{
  ly_path_predicate *plVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  uint16_t uVar5;
  ly_path_pred_type lVar6;
  LY_ERR LVar7;
  int iVar8;
  size_t sVar9;
  lysc_node *plVar10;
  long *plVar11;
  char *pcVar12;
  ly_path_predicate *plVar13;
  ly_path *plVar14;
  lyd_node *plVar15;
  lyd_node *plVar16;
  lyd_node *plVar17;
  long lVar18;
  ly_path_predicate *plVar19;
  char *pcVar20;
  ly_path *plVar21;
  ly_path_predicate **pplVar22;
  ulong uVar23;
  ly_path_predicate *plVar24;
  char *name;
  lyd_node **first_sibling_p;
  lys_module *plVar25;
  char *pcVar26;
  ly_path_predicate *plVar27;
  uint uVar28;
  uint32_t uVar29;
  ly_ctx *ctx_00;
  char *value_00;
  lysc_ext_instance *plVar30;
  char *pcVar31;
  LY_ERR local_e0;
  lyd_node *node;
  ly_ctx *local_d0;
  LY_VALUE_FORMAT format;
  lysc_ext_instance *local_c0;
  ly_path *p;
  char *local_b0;
  uint64_t path_idx;
  lyd_value *local_a0;
  char *local_98;
  lyd_node *parent_local;
  char *local_88;
  ulong local_80;
  char *local_78;
  lyxp_expr *exp;
  uint local_64;
  char *local_60;
  lyd_node *iter;
  lysc_type *plStack_50;
  anon_union_24_16_e2776397_for_lyd_value_2 local_48;
  
  exp = (lyxp_expr *)0x0;
  p = (ly_path *)0x0;
  node = (lyd_node *)0x0;
  path_idx = 0;
  parent_local = parent;
  if (parent == (lyd_node *)0x0 && ctx == (ly_ctx *)0x0) {
    __assert_fail("parent || ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                  ,0x686,
                  "LY_ERR lyd_new_path_(struct lyd_node *, const struct ly_ctx *, const struct lysc_ext_instance *, const char *, const void *, size_t, LYD_ANYDATA_VALUETYPE, uint32_t, struct lyd_node **, struct lyd_node **)"
                 );
  }
  if ((parent == (lyd_node *)0x0) && (*path != '/')) {
    __assert_fail("path && ((path[0] == \'/\') || parent)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                  ,0x687,
                  "LY_ERR lyd_new_path_(struct lyd_node *, const struct ly_ctx *, const struct lysc_ext_instance *, const char *, const void *, size_t, LYD_ANYDATA_VALUETYPE, uint32_t, struct lyd_node **, struct lyd_node **)"
                 );
  }
  if (ctx == (ly_ctx *)0x0) {
    if (parent->schema == (lysc_node *)0x0) {
      plVar25 = (lys_module *)&parent[2].schema;
    }
    else {
      plVar25 = parent->schema->module;
    }
    ctx = plVar25->ctx;
  }
  if (value_len == 0 && value != (void *)0x0) {
    value_len = strlen((char *)value);
  }
  local_e0 = lyd_new_val_get_format(options,&format);
  if (local_e0 != LY_SUCCESS) {
    plVar16 = (lyd_node *)0x0;
    plVar15 = (lyd_node *)0x0;
    plVar27 = (ly_path_predicate *)0x0;
    goto LAB_0012c764;
  }
  local_c0 = ext;
  sVar9 = strlen(path);
  local_e0 = ly_path_parse(ctx,(lysc_node *)0x0,path,sVar9,'\0',2,0x40,0x200,&exp);
  if (local_e0 == LY_SUCCESS) {
    local_a0 = (lyd_value *)path;
    plVar10 = lyd_node_schema(parent_local);
    local_e0 = ly_path_compile(ctx,(lys_module *)0x0,plVar10,local_c0,exp,((ushort)options & 1) + 1,
                               0x20,'\0',LY_VALUE_JSON,(void *)0x0,&p);
    plVar14 = p;
    if (local_e0 != LY_SUCCESS) goto LAB_0012c75b;
    local_d0 = ctx;
    local_c0 = (lysc_ext_instance *)value_len;
    local_98 = (char *)value;
    if (p == (ly_path *)0x0) {
      __assert_fail("path",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                    ,0x61f,
                    "LY_ERR lyd_new_path_check_find_lypath(struct ly_path *, const char *, const char *, size_t, LY_VALUE_FORMAT, uint32_t)"
                   );
    }
    local_b0 = (char *)(CONCAT71(local_b0._1_7_,(byte)options >> 1) & 0xffffffffffffff01);
    local_64 = options >> 8 & 0xffffff01;
    plVar27 = p[-1].predicates;
    local_80 = (ulong)format;
    pplVar22 = &p->predicates;
    bVar3 = false;
    plVar13 = plVar27;
    for (plVar24 = (ly_path_predicate *)0x0; pcVar26 = local_98, plVar30 = local_c0, ctx = local_d0,
        plVar24 < plVar13; plVar24 = (ly_path_predicate *)((long)&plVar24->type + 1)) {
      plVar10 = ((ly_path *)(pplVar22 + -2))->node;
      plVar19 = plVar24;
      bVar4 = bVar3;
      if (plVar10->nodetype == 8) {
        plVar13 = *pplVar22;
        if ((plVar10->flags & 1) == 0) {
          bVar4 = true;
          if (plVar13 != (ly_path_predicate *)0x0) {
            lVar6 = plVar13->type;
            bVar4 = true;
            if (lVar6 != LY_PATH_PREDTYPE_LEAFLIST) goto LAB_0012c8cc;
          }
        }
        else if (((plVar13 == (ly_path_predicate *)0x0) ||
                 (plVar19 = (ly_path_predicate *)path, plVar13->type != LY_PATH_PREDTYPE_LEAFLIST))
                && (((options & 0x40) == 0 ||
                    (LVar7 = lyd_value_validate((ly_ctx *)0x0,plVar10,local_98,(size_t)local_c0,
                                                (lyd_node *)0x0,(lysc_type **)0x0,(char **)0x0),
                    plVar19 = (ly_path_predicate *)path, LVar7 == LY_SUCCESS)))) {
          local_e0 = lyd_value_store(plVar10->module->ctx,(lyd_value *)&iter,
                                     (lysc_type *)plVar10[1].parent,local_98,(size_t)local_c0,'\0',
                                     '\0',(ly_bool *)0x0,(LY_VALUE_FORMAT)local_80,(void *)0x0,0x3f3
                                     ,plVar10,(ly_bool *)0x0);
          if (local_e0 != LY_SUCCESS) goto LAB_0012cb70;
          plStack_50->refcount = plStack_50->refcount + 1;
          plVar13 = *pplVar22;
          if (plVar13 == (ly_path_predicate *)0x0) {
            plVar11 = (long *)malloc(0x40);
            if (plVar11 == (long *)0x0) goto LAB_0012d185;
            *plVar11 = 1;
            lVar18 = 1;
          }
          else {
            lVar18 = *(long *)((long)&plVar13[-1].field_1 + 0x28);
            *(long *)((long)&plVar13[-1].field_1 + 0x28) = lVar18 + 1;
            plVar11 = (long *)realloc((void *)((long)&plVar13[-1].field_1 + 0x28),
                                      lVar18 * 0x38 + 0x40);
            if (plVar11 == (long *)0x0) {
              plVar11 = (long *)((long)&(*pplVar22)[-1].field_1 + 0x28);
              *plVar11 = *plVar11 + -1;
LAB_0012d185:
              local_e0 = LY_EMEM;
              ly_log(plVar10->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "lyd_new_path_check_find_lypath");
              goto LAB_0012cb70;
            }
            lVar18 = *plVar11;
          }
          *pplVar22 = (ly_path_predicate *)(plVar11 + 1);
          plVar11[lVar18 * 7 + -6] = 0;
          (plVar11 + lVar18 * 7 + -6)[1] = 0;
          *(undefined4 *)(plVar11 + lVar18 * 7 + -6) = 2;
          plVar11[lVar18 * 7 + -4] = (long)iter;
          (plVar11 + lVar18 * 7 + -4)[1] = (long)plStack_50;
          plVar11[lVar18 * 7 + -2] = local_48.dec64;
          (plVar11 + lVar18 * 7 + -2)[1] = local_48._8_8_;
          plVar11[lVar18 * 7] = local_48._16_8_;
          plVar19 = (ly_path_predicate *)path;
        }
      }
      else {
        plVar19 = (ly_path_predicate *)path;
        if (plVar10->nodetype == 0x10) {
          plVar1 = *pplVar22;
          if ((plVar10->flags & 0x200) == 0) {
            if (((plVar1 == (ly_path_predicate *)0x0) || (plVar1->type != LY_PATH_PREDTYPE_LIST)) &&
               (((options & 0x40) == 0 ||
                (plVar24 < (ly_path_predicate *)((long)&plVar13[-1].field_1 + 0x2fU))))) {
              ly_log_location(plVar10,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
              ctx_00 = plVar10->module->ctx;
              pcVar12 = lys_nodetype2str(plVar10->nodetype);
              pcVar26 = plVar10->name;
              pcVar20 = "Predicate missing for %s \"%s\" in path \"%s\".";
LAB_0012cb42:
              ly_vlog(ctx_00,(char *)0x0,LYVE_XPATH,pcVar20,pcVar12,pcVar26,local_a0);
              ly_log_location_revert(1,0,0,0);
              local_e0 = LY_EINVAL;
LAB_0012cb70:
              plVar16 = (lyd_node *)0x0;
              plVar15 = (lyd_node *)0x0;
              ctx = local_d0;
              goto LAB_0012c764;
            }
          }
          else {
            plVar19 = plVar24;
            bVar4 = true;
            if (plVar1 != (ly_path_predicate *)0x0) {
              lVar6 = plVar1->type;
LAB_0012c8cc:
              plVar19 = (ly_path_predicate *)path;
              bVar4 = bVar3;
              if (lVar6 != LY_PATH_PREDTYPE_POSITION) {
                ly_log_location(plVar10,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
                ctx_00 = plVar10->module->ctx;
                pcVar12 = lys_nodetype2str(plVar10->nodetype);
                pcVar26 = plVar10->name;
                pcVar20 = "Invalid predicate for state %s \"%s\" in path \"%s\".";
                goto LAB_0012cb42;
              }
            }
          }
        }
      }
      bVar3 = bVar4;
      plVar13 = plVar14[-1].predicates;
      pplVar22 = pplVar22 + 3;
      path = (char *)plVar19;
    }
    if (bVar3) {
      while (path < plVar13) {
        plVar13 = (ly_path_predicate *)((long)&plVar13[-1].field_1 + 0x2f);
        plVar14[-1].predicates = plVar13;
      }
    }
    if (parent_local == (lyd_node *)0x0) {
LAB_0012cc06:
      do {
        if (p == (ly_path *)0x0) {
          plVar13 = _DAT_fffffffffffffff8;
          if (plVar27 == (ly_path_predicate *)0x0) {
            plVar14 = (ly_path *)0x0;
            goto LAB_0012cc64;
          }
        }
        else {
          plVar13 = p[-1].predicates;
          if (plVar27 <= plVar13) goto LAB_0012cc28;
        }
        p[-1].predicates = (ly_path_predicate *)((long)&plVar13->type + 1);
      } while( true );
    }
    local_e0 = ly_path_eval_partial
                         (p,parent_local,(lyxp_var *)0x0,(byte)options & 0x80,&path_idx,&node);
    plVar16 = node;
    if (local_e0 == LY_EINCOMPLETE) {
      path_idx = path_idx + 1;
      goto LAB_0012cc06;
    }
    if (local_e0 == LY_ENOTFOUND) {
      if (p->node == (lysc_node *)0x0) {
        plVar10 = (lysc_node *)0x0;
      }
      else {
        plVar10 = p->node->parent;
      }
      plVar10 = lysc_data_node(plVar10);
      if (plVar10 != (lysc_node *)0x0) {
        node = parent_local;
      }
      goto LAB_0012cc06;
    }
    if (local_e0 == LY_SUCCESS) {
      if (p == (ly_path *)0x0) {
        plVar13 = (ly_path_predicate *)0x0;
      }
      else {
        plVar13 = p[-1].predicates;
      }
      if (plVar27 != plVar13) goto LAB_0012cc06;
      if ((options & 0x20) == 0) {
        if ((node->flags & 1) == 0) {
          ly_log_location((lysc_node *)0x0,node,(char *)0x0,(ly_in *)0x0);
          local_e0 = LY_EEXIST;
          ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,"Path \"%s\" already exists.",local_a0);
          ly_log_location_revert(0,1,0,0);
          plVar16 = (lyd_node *)0x0;
          plVar15 = (lyd_node *)0x0;
          goto LAB_0012c764;
        }
        plVar10 = node->schema;
LAB_0012d20d:
        uVar5 = plVar10->nodetype;
      }
      else {
        plVar10 = node->schema;
        uVar5 = plVar10->nodetype;
        if (uVar5 == 4) {
          if ((plVar10->flags & 0x100) != 0) {
            plVar16 = (lyd_node *)0x0;
            local_e0 = LY_SUCCESS;
            plVar15 = (lyd_node *)0x0;
            goto LAB_0012c764;
          }
          goto LAB_0012d20d;
        }
      }
      LVar7 = LY_SUCCESS;
      local_e0 = LY_SUCCESS;
      if (uVar5 == 1) {
        plVar16 = (lyd_node *)0x0;
        plVar15 = plVar16;
        goto LAB_0012c764;
      }
      if (uVar5 == 4) {
LAB_0012d262:
        LVar7 = _lyd_change_term(node,pcVar26,(size_t)plVar30,format);
        plVar15 = plVar16;
        if ((LVar7 & ~LY_EEXIST) != LY_SUCCESS) {
          plVar16 = (lyd_node *)0x0;
          plVar17 = (lyd_node *)(ulong)LVar7;
          if (LVar7 == LY_ENOT) {
            plVar17 = plVar16;
          }
          plVar15 = plVar16;
          local_e0 = (LY_ERR)plVar17;
        }
      }
      else {
        if ((uVar5 != 0x400) && (uVar5 != 0x10)) {
          if ((uVar5 == 0x20) || (uVar5 == 0x60)) {
            LVar7 = lyd_create_any(plVar10,pcVar26,value_type,'\0',&iter);
            plVar15 = iter;
            if (LVar7 == LY_SUCCESS) {
              LVar7 = lyd_compare_single(plVar16,iter,0);
              if (LVar7 == LY_SUCCESS) {
                plVar16 = (lyd_node *)0x0;
              }
              else {
                uVar29 = plVar16[1].flags;
                plVar15[1].hash = plVar16[1].hash;
                plVar15[1].flags = uVar29;
                *(undefined4 *)&plVar15[1].schema = *(undefined4 *)&plVar16[1].schema;
                *(char **)(plVar16 + 1) = pcVar26;
                *(LYD_ANYDATA_VALUETYPE *)&plVar16[1].schema = value_type;
              }
              lyd_free_tree(plVar15);
              plVar15 = plVar16;
              local_e0 = LY_SUCCESS;
              goto LAB_0012c764;
            }
          }
          else if ((uVar5 != 0x100) && (uVar5 != 0x200)) {
            if (uVar5 != 8) {
              plVar16 = (lyd_node *)0x0;
              ly_log(plVar10->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                     ,0x60c);
              plVar15 = plVar16;
              local_e0 = LY_EINT;
              goto LAB_0012c764;
            }
            if ((plVar10->flags & 1) != 0) {
              plVar16 = (lyd_node *)0x0;
              plVar15 = plVar16;
              local_e0 = LY_SUCCESS;
              goto LAB_0012c764;
            }
            goto LAB_0012d262;
          }
        }
        plVar16 = (lyd_node *)0x0;
        plVar15 = plVar16;
        local_e0 = LVar7;
      }
      goto LAB_0012c764;
    }
  }
  else {
LAB_0012c75b:
    plVar27 = (ly_path_predicate *)0x0;
  }
  plVar16 = (lyd_node *)0x0;
  plVar15 = (lyd_node *)0x0;
LAB_0012c764:
  lyxp_expr_free(ctx,exp);
  if (p != (ly_path *)0x0) {
    plVar13 = p[-1].predicates;
    while (plVar13 < plVar27) {
      plVar13 = (ly_path_predicate *)((long)&plVar13->type + 1);
      p[-1].predicates = plVar13;
    }
  }
  ly_path_free(p);
  if (local_e0 == LY_SUCCESS) {
    if (new_parent != (lyd_node **)0x0) {
      *new_parent = plVar16;
    }
    if (new_node != (lyd_node **)0x0) {
      *new_node = plVar15;
    }
  }
  else {
    lyd_free_tree(plVar16);
  }
  return local_e0;
LAB_0012cc28:
  plVar14 = p;
  if (plVar13 <= path_idx) {
LAB_0012cc64:
    local_60 = "";
    if (local_98 != (char *)0x0) {
      local_60 = local_98;
    }
    local_80 = CONCAT44(local_80._4_4_,(uint)(byte)local_b0);
    plVar16 = (lyd_node *)0x0;
    local_a0 = (lyd_value *)0x0;
    pcVar26 = local_98;
    plVar15 = (lyd_node *)0x0;
    do {
      ctx = local_d0;
      plVar17 = node;
      local_e0 = LY_SUCCESS;
      if ((plVar14 == (ly_path *)0x0) || (plVar14[-1].predicates <= path_idx)) goto LAB_0012c764;
      plVar10 = plVar14[path_idx].node;
      uVar5 = plVar10->nodetype;
      if (uVar5 == 1) goto LAB_0012cdbd;
      if (uVar5 == 4) {
        if (((plVar10->flags & 0x100) == 0) || (node->schema == (lysc_node *)0x0)) {
          if (((options & 0x40) != 0) &&
             (((node != (lyd_node *)0x0 && (node->schema == (lysc_node *)0x0)) ||
              ((LVar7 = lyd_value_validate((ly_ctx *)0x0,plVar10,local_60,(size_t)local_c0,
                                           (lyd_node *)0x0,(lysc_type **)0x0,(char **)0x0),
               LVar7 != LY_SUCCESS && (LVar7 != LY_EINCOMPLETE)))))) {
            if (format == LY_VALUE_JSON && pcVar26 != (char *)0x0) {
              iVar8 = ly_strncmp("[null]",pcVar26,(size_t)local_c0);
              uVar28 = (uint)(iVar8 == 0);
              goto LAB_0012d03e;
            }
            uVar29 = 0;
            goto LAB_0012d05d;
          }
          local_e0 = lyd_create_term(plVar10,pcVar26,(size_t)local_c0,'\0',(ly_bool)local_80,
                                     (ly_bool *)0x0,format,(void *)0x0,0x3f3,(ly_bool *)0x0,&node);
          goto LAB_0012d0c0;
        }
        plVar15 = lyd_child(node);
        lyd_find_sibling_schema(plVar15,plVar10,&node);
        if (node == (lyd_node *)0x0) {
          __assert_fail("node",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                        ,0x71d,
                        "LY_ERR lyd_new_path_(struct lyd_node *, const struct ly_ctx *, const struct lysc_ext_instance *, const char *, const void *, size_t, LYD_ANYDATA_VALUETYPE, uint32_t, struct lyd_node **, struct lyd_node **)"
                       );
        }
      }
      else {
        if (uVar5 == 8) {
          if ((((options & 0x40) == 0) ||
              ((plVar14[path_idx].predicates != (ly_path_predicate *)0x0 &&
               ((plVar14[path_idx].predicates)->type == LY_PATH_PREDTYPE_LEAFLIST)))) ||
             (((plVar10->flags & 1) == 0 &&
              ((LVar7 = lyd_value_validate((ly_ctx *)0x0,plVar10,local_60,(size_t)local_c0,
                                           (lyd_node *)0x0,(lysc_type **)0x0,(char **)0x0),
               LVar7 == LY_SUCCESS || (LVar7 == LY_EINCOMPLETE)))))) {
            plVar13 = p[path_idx].predicates;
            if ((plVar13 == (ly_path_predicate *)0x0) ||
               (plVar13->type != LY_PATH_PREDTYPE_LEAFLIST)) {
              if (local_a0 == (lyd_value *)0x0) {
                local_e0 = lyd_create_term(plVar10,pcVar26,(size_t)local_c0,'\0',(ly_bool)local_80,
                                           (ly_bool *)0x0,format,(void *)0x0,0x3f3,(ly_bool *)0x0,
                                           &node);
                local_a0 = (lyd_value *)0x0;
                goto LAB_0012d0c0;
              }
            }
            else {
              local_a0 = (lyd_value *)&(plVar13->field_1).field_1.field_1;
            }
            local_e0 = lyd_create_term2(plVar10,local_a0,&node);
          }
          else {
            if (format == LY_VALUE_JSON && pcVar26 != (char *)0x0) {
              iVar8 = ly_strncmp("[null]",pcVar26,(size_t)local_c0);
              uVar28 = iVar8 == 0 | 4;
LAB_0012d03e:
              uVar29 = uVar28 << 6;
            }
            else {
              uVar29 = 0x100;
            }
LAB_0012d05d:
            local_b0 = (char *)(ulong)format;
            local_88 = plVar10->name;
            local_78 = (char *)strlen(local_88);
            pcVar12 = plVar10->module->name;
            sVar9 = strlen(pcVar12);
            pcVar20 = local_78;
            name = local_88;
            pcVar26 = local_98;
            value_00 = local_98;
            plVar30 = local_c0;
            pcVar31 = local_b0;
LAB_0012d0b7:
            local_e0 = lyd_create_opaq(local_d0,name,(size_t)pcVar20,(char *)0x0,0,pcVar12,sVar9,
                                       value_00,(size_t)plVar30,(ly_bool *)0x0,
                                       (LY_VALUE_FORMAT)pcVar31,(void *)0x0,uVar29,&node);
          }
LAB_0012d0c0:
          ctx = local_d0;
          if (local_e0 != LY_SUCCESS) goto LAB_0012c764;
        }
        else {
          if (uVar5 != 0x400) {
            if ((uVar5 == 0x20) || (uVar5 == 0x60)) {
              local_e0 = lyd_create_any(plVar10,pcVar26,value_type,(ly_bool)local_64,&node);
              goto LAB_0012d0c0;
            }
            if ((uVar5 != 0x100) && (uVar5 != 0x200)) {
              if (uVar5 != 0x10) {
                local_e0 = LY_EINT;
                ly_log(local_d0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                       "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                       ,0x73e);
                goto LAB_0012c764;
              }
              if ((plVar10->flags & 0x200) == 0) {
                if (((options & 0x40) == 0) ||
                   (plVar14[path_idx].predicates != (ly_path_predicate *)0x0)) {
                  local_e0 = lyd_create_list(plVar10,plVar14[path_idx].predicates,(lyxp_var *)0x0,
                                             (ly_bool)local_80,&node);
                  goto LAB_0012d0c0;
                }
                local_b0 = plVar10->name;
                local_88 = (char *)strlen(local_b0);
                pcVar12 = plVar10->module->name;
                sVar9 = strlen(pcVar12);
                uVar29 = 0x80;
                pcVar20 = local_88;
                name = local_b0;
                value_00 = (char *)0x0;
                plVar30 = (lysc_ext_instance *)0x0;
                pcVar31 = (char *)0x4;
                goto LAB_0012d0b7;
              }
            }
          }
LAB_0012cdbd:
          LVar7 = lyd_create_inner(plVar10,&node);
          if (LVar7 != LY_SUCCESS) {
            local_e0 = LY_EMEM;
            ctx = local_d0;
            goto LAB_0012c764;
          }
        }
        if (p[path_idx].ext != (lysc_ext_instance *)0x0) {
          node->flags = node->flags | 8;
        }
        if (plVar17 == (lyd_node *)0x0) {
          if (parent_local == (lyd_node *)0x0) goto LAB_0012d10c;
          plVar17 = (lyd_node *)0x0;
          first_sibling_p = &parent_local;
        }
        else {
          first_sibling_p = (lyd_node **)0x0;
        }
        lyd_insert_node(plVar17,first_sibling_p,node,0);
      }
LAB_0012d10c:
      if (plVar16 == (lyd_node *)0x0) {
        plVar16 = node;
      }
      path_idx = path_idx + 1;
      plVar14 = p;
      plVar15 = node;
    } while( true );
  }
  plVar10 = p[path_idx].node;
  if (plVar10 == (lysc_node *)0x0) goto LAB_0012cc64;
  if (plVar10->nodetype == 8) {
    if ((plVar10->flags & 1) != 0) goto LAB_0012cc64;
  }
  else if ((plVar10->nodetype != 0x10) || ((plVar10->flags & 0x200) == 0)) goto LAB_0012cc64;
  if ((p[path_idx].predicates == (ly_path_predicate *)0x0) ||
     ((p[path_idx].predicates)->type != LY_PATH_PREDTYPE_POSITION)) goto LAB_0012cc64;
  plVar16 = parent_local;
  if (node != (lyd_node *)0x0) {
    plVar16 = lyd_child(node);
  }
  uVar23 = 0;
  lyd_find_sibling_val(plVar16,plVar10,(char *)0x0,0,&iter);
  ctx = local_d0;
  plVar21 = p + path_idx;
  for (; (iVar8 = (int)uVar23, iter != (lyd_node *)0x0 && (iter->schema == plVar21->node));
      iter = iter->next) {
    uVar23 = (ulong)(iVar8 + 1);
  }
  uVar2 = (plVar21->predicates->field_1).position;
  plVar14 = p;
  if (uVar2 <= iVar8 + 1) goto LAB_0012cc64;
  pcVar26 = plVar21->node->name;
  if (iVar8 == 0) {
    ly_vlog(local_d0,(char *)0x0,LYVE_REFERENCE,
            "Cannot create \"%s\" on position %lu, no instances exist.",pcVar26);
  }
  else {
    pcVar20 = "";
    pcVar12 = "s";
    if (iVar8 == 1) {
      pcVar12 = "";
      pcVar20 = "s";
    }
    ly_vlog(local_d0,(char *)0x0,LYVE_REFERENCE,
            "Cannot create \"%s\" on position %lu, only %u instance%s exist%s.",pcVar26,uVar2,uVar23
            ,pcVar12,pcVar20);
  }
  plVar16 = (lyd_node *)0x0;
  plVar15 = (lyd_node *)0x0;
  local_e0 = LY_EINVAL;
  goto LAB_0012c764;
}

Assistant:

static LY_ERR
lyd_new_path_(struct lyd_node *parent, const struct ly_ctx *ctx, const struct lysc_ext_instance *ext, const char *path,
        const void *value, size_t value_len, LYD_ANYDATA_VALUETYPE value_type, uint32_t options,
        struct lyd_node **new_parent, struct lyd_node **new_node)
{
    LY_ERR ret = LY_SUCCESS, r;
    struct lyxp_expr *exp = NULL;
    struct ly_path *p = NULL;
    struct lyd_node *nparent = NULL, *nnode = NULL, *node = NULL, *cur_parent, *iter;
    const struct lysc_node *schema;
    const struct lyd_value *val = NULL;
    ly_bool store_only = (options & LYD_NEW_VAL_STORE_ONLY) ? 1 : 0;
    ly_bool any_use_value = (options & LYD_NEW_ANY_USE_VALUE) ? 1 : 0;
    LY_ARRAY_COUNT_TYPE path_idx = 0, orig_count = 0;
    LY_VALUE_FORMAT format;
    uint32_t hints, count;

    assert(parent || ctx);
    assert(path && ((path[0] == '/') || parent));

    if (!ctx) {
        ctx = LYD_CTX(parent);
    }
    if (value && !value_len) {
        value_len = strlen(value);
    }
    LY_CHECK_GOTO(ret = lyd_new_val_get_format(options, &format), cleanup);

    /* parse path */
    LY_CHECK_GOTO(ret = ly_path_parse(ctx, NULL, path, strlen(path), 0, LY_PATH_BEGIN_EITHER, LY_PATH_PREFIX_FIRST,
            LY_PATH_PRED_SIMPLE, &exp), cleanup);

    /* compile path */
    LY_CHECK_GOTO(ret = ly_path_compile(ctx, NULL, lyd_node_schema(parent), ext, exp, options & LYD_NEW_VAL_OUTPUT ?
            LY_PATH_OPER_OUTPUT : LY_PATH_OPER_INPUT, LY_PATH_TARGET_MANY, 0, LY_VALUE_JSON, NULL, &p), cleanup);

    /* check the compiled path before searching existing nodes, it may be shortened */
    orig_count = LY_ARRAY_COUNT(p);
    LY_CHECK_GOTO(ret = lyd_new_path_check_find_lypath(p, path, value, value_len, format, options), cleanup);

    /* try to find any existing nodes in the path */
    if (parent) {
        r = ly_path_eval_partial(p, parent, NULL, options & LYD_NEW_PATH_WITH_OPAQ, &path_idx, &node);
        if (r == LY_SUCCESS) {
            if (orig_count == LY_ARRAY_COUNT(p)) {
                /* the node exists, are we supposed to update it or is it just a default? */
                if (!(options & LYD_NEW_PATH_UPDATE) && !(node->flags & LYD_DEFAULT)) {
                    LOG_LOCSET(NULL, node);
                    LOGVAL(ctx, LYVE_REFERENCE, "Path \"%s\" already exists.", path);
                    LOG_LOCBACK(0, 1);
                    ret = LY_EEXIST;
                    goto cleanup;
                } else if ((options & LYD_NEW_PATH_UPDATE) && lysc_is_key(node->schema)) {
                    /* fine, the key value must not be changed and has to be in the predicate to be found */
                    goto cleanup;
                }

                /* update the existing node */
                ret = lyd_new_path_update(node, value, value_len, value_type, format, &nparent, &nnode);
                goto cleanup;
            } /* else we were not searching for the whole path */
        } else if (r == LY_EINCOMPLETE) {
            /* some nodes were found, adjust the iterator to the next segment to be created */
            ++path_idx;
        } else if (r == LY_ENOTFOUND) {
            /* we will create the nodes from top-level, default behavior (absolute path), or from the parent (relative path) */
            if (lysc_data_parent(p[0].node)) {
                node = parent;
            }
        } else {
            /* error */
            ret = r;
            goto cleanup;
        }
    }

    /* restore the full path for creating new nodes */
    while (orig_count > LY_ARRAY_COUNT(p)) {
        LY_ARRAY_INCREMENT(p);
    }

    if ((path_idx < LY_ARRAY_COUNT(p)) && lysc_is_dup_inst_list(p[path_idx].node) && p[path_idx].predicates &&
            (p[path_idx].predicates[0].type == LY_PATH_PREDTYPE_POSITION)) {
        /* check the used position of a key-less list or state leaf-list */
        count = 0;
        LYD_LIST_FOR_INST(node ? lyd_child(node) : parent, p[path_idx].node, iter) {
            ++count;
        }

        if (count + 1 < p[path_idx].predicates[0].position) {
            if (count) {
                LOGVAL(ctx, LYVE_REFERENCE,
                        "Cannot create \"%s\" on position %" PRIu64 ", only %" PRIu32 " instance%s exist%s.",
                        p[path_idx].node->name, p[path_idx].predicates[0].position, count, (count > 1) ? "s" : "",
                        (count > 1) ? "" : "s");
            } else {
                LOGVAL(ctx, LYVE_REFERENCE, "Cannot create \"%s\" on position %" PRIu64 ", no instances exist.",
                        p[path_idx].node->name, p[path_idx].predicates[0].position);
            }
            ret = LY_EINVAL;
            goto cleanup;
        }
    }

    /* create all the non-existing nodes in a loop */
    for ( ; path_idx < LY_ARRAY_COUNT(p); ++path_idx) {
        cur_parent = node;
        schema = p[path_idx].node;

        switch (schema->nodetype) {
        case LYS_LIST:
            if (lysc_is_dup_inst_list(schema)) {
                /* create key-less list instance */
                LY_CHECK_GOTO(ret = lyd_create_inner(schema, &node), cleanup);
            } else if ((options & LYD_NEW_PATH_OPAQ) && !p[path_idx].predicates) {
                /* creating opaque list without keys */
                LY_CHECK_GOTO(ret = lyd_create_opaq(ctx, schema->name, strlen(schema->name), NULL, 0,
                        schema->module->name, strlen(schema->module->name), NULL, 0, NULL, LY_VALUE_JSON, NULL,
                        LYD_NODEHINT_LIST, &node), cleanup);
            } else {
                /* create standard list instance */
                LY_CHECK_GOTO(ret = lyd_create_list(schema, p[path_idx].predicates, NULL, store_only, &node), cleanup);
            }
            break;
        case LYS_CONTAINER:
        case LYS_NOTIF:
        case LYS_RPC:
        case LYS_ACTION:
            LY_CHECK_GOTO(ret = lyd_create_inner(schema, &node), cleanup);
            break;
        case LYS_LEAFLIST:
            if ((options & LYD_NEW_PATH_OPAQ) &&
                    (!p[path_idx].predicates || (p[path_idx].predicates[0].type != LY_PATH_PREDTYPE_LEAFLIST))) {
                /* we have not checked this only for dup-inst lists, otherwise it must be opaque */
                r = LY_EVALID;
                if (lysc_is_dup_inst_list(schema)) {
                    /* validate value */
                    r = lyd_value_validate(NULL, schema, value ? value : "", value_len, NULL, NULL, NULL);
                }
                if (r && (r != LY_EINCOMPLETE)) {
                    /* creating opaque leaf-list */
                    hints = LYD_NODEHINT_LEAFLIST;
                    if (value && (format == LY_VALUE_JSON) && !ly_strncmp("[null]", value, value_len)) {
                        hints |= LYD_VALHINT_EMPTY;
                    }
                    LY_CHECK_GOTO(ret = lyd_create_opaq(ctx, schema->name, strlen(schema->name), NULL, 0,
                            schema->module->name, strlen(schema->module->name), value, value_len, NULL, format, NULL,
                            hints, &node), cleanup);
                    break;
                }
            }

            /* get value to set */
            if (p[path_idx].predicates && (p[path_idx].predicates[0].type == LY_PATH_PREDTYPE_LEAFLIST)) {
                val = &p[path_idx].predicates[0].value;
            }

            /* create a leaf-list instance */
            if (val) {
                LY_CHECK_GOTO(ret = lyd_create_term2(schema, val, &node), cleanup);
            } else {
                LY_CHECK_GOTO(ret = lyd_create_term(schema, value, value_len, 0, store_only, NULL, format, NULL, LYD_HINT_DATA, NULL, &node), cleanup);
            }
            break;
        case LYS_LEAF:
            if (lysc_is_key(schema) && cur_parent->schema) {
                /* it must have been already created or some error will occur later */
                lyd_find_sibling_schema(lyd_child(cur_parent), schema, &node);
                assert(node);
                goto next_iter;
            }

            if (options & LYD_NEW_PATH_OPAQ) {
                if (cur_parent && !cur_parent->schema) {
                    /* always create opaque nodes for opaque parents */
                    r = LY_ENOT;
                } else {
                    /* validate value */
                    r = lyd_value_validate(NULL, schema, value ? value : "", value_len, NULL, NULL, NULL);
                }
                if (r && (r != LY_EINCOMPLETE)) {
                    /* creating opaque leaf */
                    hints = 0;
                    if (value && (format == LY_VALUE_JSON) && !ly_strncmp("[null]", value, value_len)) {
                        hints |= LYD_VALHINT_EMPTY;
                    }
                    LY_CHECK_GOTO(ret = lyd_create_opaq(ctx, schema->name, strlen(schema->name), NULL, 0,
                            schema->module->name, strlen(schema->module->name), value, value_len, NULL, format, NULL, hints, &node),
                            cleanup);
                    break;
                }
            }

            /* create a leaf instance */
            LY_CHECK_GOTO(ret = lyd_create_term(schema, value, value_len, 0, store_only, NULL, format, NULL, LYD_HINT_DATA, NULL, &node), cleanup);
            break;
        case LYS_ANYDATA:
        case LYS_ANYXML:
            LY_CHECK_GOTO(ret = lyd_create_any(schema, value, value_type, any_use_value, &node), cleanup);
            break;
        default:
            LOGINT(ctx);
            ret = LY_EINT;
            goto cleanup;
        }

        if (p[path_idx].ext) {
            node->flags |= LYD_EXT;
        }
        if (cur_parent) {
            /* connect to the parent */
            lyd_insert_node(cur_parent, NULL, node, LYD_INSERT_NODE_DEFAULT);
        } else if (parent) {
            /* connect to top-level siblings */
            lyd_insert_node(NULL, &parent, node, LYD_INSERT_NODE_DEFAULT);
        }

next_iter:
        /* update remembered nodes */
        if (!nparent) {
            nparent = node;
        }
        nnode = node;
    }

cleanup:
    lyxp_expr_free(ctx, exp);
    if (p) {
        while (orig_count > LY_ARRAY_COUNT(p)) {
            LY_ARRAY_INCREMENT(p);
        }
    }
    ly_path_free(p);
    if (!ret) {
        /* set out params only on success */
        if (new_parent) {
            *new_parent = nparent;
        }
        if (new_node) {
            *new_node = nnode;
        }
    } else {
        lyd_free_tree(nparent);
    }
    return ret;
}